

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O1

bool slang::ast::anon_unknown_39::lookupDownward
               (span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>
                nameParts,NameComponents name,ASTContext *context,
               bitmask<slang::ast::LookupFlags> flags,LookupResult *result)

{
  SmallVector<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_4UL>
  *this;
  Diagnostics *this_00;
  char *pcVar1;
  SymbolKind SVar2;
  __normal_iterator<const_slang::syntax::ElementSelectSyntax_*const_*,_std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>_>
  first;
  ParameterValueAssignmentSyntax *this_01;
  InterfacePortSymbol *pIVar3;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_02;
  long lVar4;
  uint uVar5;
  string_view arg;
  string_view name_00;
  string_view name_01;
  string_view arg_00;
  string_view arg_01;
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  SourceRange range_03;
  size_t __n;
  char *__s1;
  pointer pNVar6;
  byte bVar7;
  bool bVar8;
  bool bVar9;
  DiagCode DVar11;
  uint uVar10;
  int iVar12;
  SourceLocation SVar13;
  Diagnostic *pDVar14;
  Type *this_03;
  InterfacePortSymbol *this_04;
  Symbol *pSVar15;
  DefinitionSymbol *pDVar16;
  uint64_t uVar17;
  SourceLocation SVar18;
  Scope *pSVar19;
  Symbol *pSVar20;
  ulong uVar21;
  DiagCode code;
  DiagCode code_00;
  pointer pNVar22;
  ulong uVar23;
  long lVar24;
  pointer pNVar25;
  LookupResult *in_R9;
  byte unaff_R13B;
  size_t *psVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  char cVar40;
  char cVar41;
  char cVar42;
  char cVar43;
  char cVar44;
  span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> selectors;
  span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> selectors_00;
  IfaceConn IVar45;
  SourceRange range_04;
  SourceRange range_05;
  SourceRange range_06;
  SourceRange range_07;
  _Variadic_union<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
  local_98;
  undefined1 local_70;
  char local_68;
  char cStack_67;
  char cStack_66;
  char cStack_65;
  char cStack_64;
  char cStack_63;
  char cStack_62;
  char cStack_61;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  char cStack_5d;
  char cStack_5c;
  char cStack_5b;
  char cStack_5a;
  char cStack_59;
  SourceLocation local_58;
  SourceLocation SStack_50;
  size_t local_48;
  char *pcStack_40;
  
  pNVar25 = nameParts._M_ptr;
  this_04 = (InterfacePortSymbol *)result->found;
  result->found = (Symbol *)0x0;
  if (nameParts._M_extent._M_extent_value._M_extent_value == 0) {
    bVar27 = true;
  }
  else {
    this_00 = &result->diagnostics;
    this = &result->selectors;
    bVar27 = false;
    pNVar22 = pNVar25 + nameParts._M_extent._M_extent_value._M_extent_value;
    SVar18 = (SourceLocation)result;
    do {
      if ((this_04 != (InterfacePortSymbol *)0x0) &&
         (name.paramAssignments != (ParameterValueAssignmentSyntax *)0x0 &&
          (this_04->super_Symbol).kind != GenericClassDef)) {
        pSVar19 = (context->scope).ptr;
        local_98._0_16_ =
             (undefined1  [16])
             slang::syntax::SyntaxNode::getFirstToken(&(name.paramAssignments)->super_SyntaxNode);
        SVar18 = parsing::Token::location((Token *)&local_98._M_first);
        pDVar14 = Diagnostics::add(this_00,pSVar19->thisSym,(DiagCode)0x1f000a,SVar18);
        range_02.endLoc = name.range.endLoc;
        range_02.startLoc = name.range.startLoc;
        Diagnostic::operator<<(pDVar14,range_02);
        Diagnostic::operator<<(pDVar14,(this_04->super_Symbol).name);
        Diagnostic::addNote(pDVar14,(DiagCode)0x50001,(this_04->super_Symbol).location);
        bVar27 = false;
        unaff_R13B = 0;
        goto LAB_002ef0f5;
      }
      uVar10 = (this_04->super_Symbol).kind - ConstraintBlock;
      if ((0x14 < uVar10) || (bVar8 = true, (0x182381U >> (uVar10 & 0x1f) & 1) == 0)) {
        bVar8 = Symbol::isValue(&this_04->super_Symbol);
        if (bVar8) {
          this_03 = DeclaredType::getType((DeclaredType *)&this_04->interfaceDef);
          if (this_03->canonical == (Type *)0x0) {
            Type::resolveCanonical(this_03);
          }
          bVar8 = (this_03->canonical->super_Symbol).kind != VirtualInterfaceType;
          if (!bVar8) {
            Compilation::noteReference
                      (((context->scope).ptr)->compilation,&this_04->super_Symbol,false);
            range_05.endLoc = SVar18;
            range_05.startLoc = name.range.endLoc;
            this_04 = (InterfacePortSymbol *)
                      getVirtualInterfaceTarget
                                ((anon_unknown_39 *)this_03,(Type *)context,
                                 (ASTContext *)name.range.startLoc,range_05);
            bVar27 = true;
          }
        }
        else {
          bVar8 = false;
        }
      }
      if (bVar8) {
        SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
        ::
        append<__gnu_cxx::__normal_iterator<const_slang::syntax::ElementSelectSyntax_*const_*,_std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>_>_>
                  (&this->
                    super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                   ,(__normal_iterator<const_slang::syntax::ElementSelectSyntax_*const_*,_std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>_>
                     )name.selectors._M_ptr,
                   (__normal_iterator<const_slang::syntax::ElementSelectSyntax_*const_*,_std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>_>
                    )(name.selectors._M_ptr + name.selectors._M_extent._M_extent_value));
        pNVar6 = pNVar22;
        do {
          pNVar22 = pNVar6;
          if (pNVar22 == pNVar25) {
            name.selectors._M_extent._M_extent_value = 0;
            name.selectors._M_ptr = (pointer)0x0;
            iVar12 = 4;
            goto LAB_002ee97c;
          }
          local_48 = pNVar22[-1].name.text._M_len;
          pcStack_40 = pNVar22[-1].name.text._M_str;
          local_98._0_16_ = *(undefined1 (*) [16])&pNVar22[-1].name.text;
          local_98._16_8_ = pNVar22[-1].dotLocation;
          local_98._24_8_ = pNVar22[-1].name.range.startLoc;
          local_98._32_8_ = pNVar22[-1].name.range.endLoc;
          local_70 = 1;
          local_58 = (SourceLocation)local_98._24_8_;
          SStack_50 = (SourceLocation)local_98._32_8_;
          SmallVectorBase<std::variant<slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>>
          ::
          emplace_back<std::variant<slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>>
                    ((SmallVectorBase<std::variant<slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>>
                      *)this,(variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                              *)&local_98._M_first);
          first._M_current = pNVar22[-1].name.selectors._M_ptr;
          SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
          ::
          append<__gnu_cxx::__normal_iterator<const_slang::syntax::ElementSelectSyntax_*const_*,_std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>_>_>
                    (&this->
                      super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                     ,first,(__normal_iterator<const_slang::syntax::ElementSelectSyntax_*const_*,_std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>_>
                             )(first._M_current +
                              pNVar22[-1].name.selectors._M_extent._M_extent_value));
          bVar7 = 1;
          if (((this_04 != (InterfacePortSymbol *)0x0) &&
              ((this_04->super_Symbol).kind != GenericClassDef)) &&
             (this_01 = pNVar22[-1].name.paramAssignments,
             this_01 != (ParameterValueAssignmentSyntax *)0x0)) {
            pSVar19 = (context->scope).ptr;
            local_98._0_16_ =
                 (undefined1  [16])
                 slang::syntax::SyntaxNode::getFirstToken(&this_01->super_SyntaxNode);
            SVar13 = parsing::Token::location((Token *)&local_98._M_first);
            pDVar14 = Diagnostics::add(this_00,pSVar19->thisSym,(DiagCode)0x1f000a,SVar13);
            Diagnostic::operator<<(pDVar14,pNVar22[-1].name.range);
            Diagnostic::operator<<(pDVar14,(this_04->super_Symbol).name);
            Diagnostic::addNote(pDVar14,(DiagCode)0x50001,(this_04->super_Symbol).location);
            bVar7 = 0;
          }
          unaff_R13B = unaff_R13B & bVar7;
          pNVar6 = pNVar22 + -1;
        } while (bVar7 != 0);
        iVar12 = 1;
LAB_002ee97c:
        bVar8 = false;
      }
      else {
        SVar2 = (this_04->super_Symbol).kind;
        if (pNVar22 != pNVar25 + nameParts._M_extent._M_extent_value._M_extent_value) {
          if ((((flags.m_bits >> 10 & 1) == 0) || (GenerateBlockArray < SVar2)) ||
             ((0x182000000000000U >> ((ulong)SVar2 & 0x3f) & 1) == 0)) {
LAB_002ee9a2:
            bVar7 = 2;
            if (SVar2 != ClockingBlock && !bVar27) {
LAB_002eea37:
              (result->flags).m_bits = (result->flags).m_bits | bVar7;
              SmallVectorBase<slang::ast::HierarchicalReference::Element>::
              emplace_back<slang::ast::Symbol_const&>
                        (&(result->path).
                          super_SmallVectorBase<slang::ast::HierarchicalReference::Element>,
                         &this_04->super_Symbol);
            }
            goto LAB_002eea4f;
          }
          SVar18 = (pNVar25->name).range.endLoc;
          range_04.endLoc = SVar18;
          range_04.startLoc = name.range.startLoc;
          Diagnostics::add(this_00,((context->scope).ptr)->thisSym,(DiagCode)0x13000a,range_04);
          goto LAB_002eeab1;
        }
        if (SVar2 != CompilationUnit) {
          if (SVar2 == InterfacePort) {
            bVar7 = 0x20;
            goto LAB_002eea37;
          }
          if (SVar2 != Package) goto LAB_002ee9a2;
        }
LAB_002eea4f:
        if ((this_04->super_Symbol).kind == InterfacePort) {
          IVar45 = InterfacePortSymbol::getConnection(this_04);
          this_04 = (InterfacePortSymbol *)IVar45.first;
          unaff_R13B = unaff_R13B & this_04 != (InterfacePortSymbol *)0x0;
          if (this_04 != (InterfacePortSymbol *)0x0) goto LAB_002eea7b;
LAB_002eede0:
          bVar8 = false;
          iVar12 = 1;
        }
        else {
          IVar45.second = (ModportSymbol *)0x0;
          IVar45.first = &this_04->super_Symbol;
LAB_002eea7b:
          this_04 = (InterfacePortSymbol *)IVar45.first;
          pSVar19 = Symbol::scopeOrNull((Symbol *)this_04);
          if (((pSVar19 == (Scope *)0x0) && ((this_04->super_Symbol).kind != Instance)) ||
             ((bVar8 = Symbol::isType((Symbol *)this_04), bVar8 ||
              ((this_04->super_Symbol).kind == Checker)))) {
            if ((this_04->super_Symbol).kind != UninstantiatedDef) {
              this_04 = (InterfacePortSymbol *)
                        unwrapTypeParam((context->scope).ptr,(Symbol *)this_04);
              if (this_04 == (InterfacePortSymbol *)0x0) {
LAB_002eedda:
                unaff_R13B = 0;
              }
              else {
                bVar8 = Symbol::isType((Symbol *)this_04);
                if (bVar8) {
                  if (this_04->interfaceDef == (DefinitionSymbol *)0x0) {
                    Type::resolveCanonical((Type *)this_04);
                  }
                  bVar8 = true;
                  if ((this_04->interfaceDef->super_Symbol).kind == ErrorType) goto LAB_002eedda;
                }
                else {
                  bVar8 = (this_04->super_Symbol).kind == GenericClassDef;
                }
                code.subsystem = Lookup;
                code.code = 9;
                if (!bVar8) {
                  DVar11.subsystem = Lookup;
                  DVar11.code = 3;
                  code.subsystem = Lookup;
                  code.code = 0x21;
                  if (((this_04->super_Symbol).kind & ~Root) == Checker) {
                    code = DVar11;
                  }
                }
                pDVar14 = Diagnostics::add(this_00,((context->scope).ptr)->thisSym,code,
                                           pNVar22[-1].dotLocation);
                range.endLoc = name.range.endLoc;
                range.startLoc = name.range.startLoc;
                Diagnostic::operator<<(pDVar14,range);
                Diagnostic::operator<<(pDVar14,pNVar22[-1].name.range);
                if (!bVar8) {
                  arg._M_str = name.text._M_str;
                  arg._M_len = name.text._M_len;
                  Diagnostic::operator<<(pDVar14,arg);
                }
                Diagnostic::addNote(pDVar14,(DiagCode)0x50001,(this_04->super_Symbol).location);
LAB_002eec60:
                unaff_R13B = 1;
              }
              goto LAB_002eede0;
            }
          }
          else if ((name.selectors._M_extent._M_extent_value == 0) ||
                  (selectors._M_extent._M_extent_value = (size_t)context,
                  selectors._M_ptr = (pointer)name.selectors._M_extent._M_extent_value,
                  SVar18 = (SourceLocation)result,
                  this_04 = (InterfacePortSymbol *)
                            Lookup::selectChild((Lookup *)this_04,(Symbol *)name.selectors._M_ptr,
                                                selectors,(ASTContext *)result,in_R9),
                  this_04 != (InterfacePortSymbol *)0x0)) {
            SVar2 = (this_04->super_Symbol).kind;
            if (SVar2 == GenerateBlock) {
              if (this_04[1].super_Symbol.field_0x4 != '\0') {
                unaff_R13B = 1;
                iVar12 = 1;
                bVar8 = false;
                goto LAB_002eede5;
              }
            }
            else if (SVar2 == Instance) {
              pIVar3 = (InterfacePortSymbol *)(this_04->modport)._M_str;
              this_04 = pIVar3;
              if (IVar45.second != (ModportSymbol *)0x0) {
                this_04 = (InterfacePortSymbol *)
                          Scope::find((Scope *)&pIVar3->interfaceDef,
                                      ((IVar45.second)->super_Symbol).name);
              }
              if (*(int *)(*(long *)&pIVar3[1].super_Symbol.location.field_0x0 + 0x48) == 2) {
                pSVar20 = ((context->scope).ptr)->thisSym;
                for (pSVar15 = pSVar20; pSVar15->kind != AnonymousProgram;
                    pSVar15 = pSVar15->parentScope->thisSym) {
                  if (pSVar15->kind == InstanceBody) {
                    if (*(int *)(pSVar15[2].name._M_str + 0x48) != 2) {
LAB_002eec90:
                      SVar18 = (pNVar25->name).range.endLoc;
                      range_06.endLoc = SVar18;
                      range_06.startLoc = name.range.startLoc;
                      Diagnostics::add(this_00,pSVar20,(DiagCode)0xf000a,range_06);
                    }
                    break;
                  }
                  if (pSVar15->parentScope == (Scope *)0x0) goto LAB_002eec90;
                }
              }
            }
            name.text._M_len = pNVar22[-1].name.text._M_len;
            name.text._M_str = pNVar22[-1].name.text._M_str;
            name.range.startLoc = pNVar22[-1].name.range.startLoc;
            name.range.endLoc = pNVar22[-1].name.range.endLoc;
            name.selectors._M_ptr = pNVar22[-1].name.selectors._M_ptr;
            name.selectors._M_extent._M_extent_value =
                 pNVar22[-1].name.selectors._M_extent._M_extent_value;
            name.paramAssignments = pNVar22[-1].name.paramAssignments;
            if (name.text._M_len != 0) {
              pSVar19 = Symbol::scopeOrNull(&this_04->super_Symbol);
              name_00._M_str = name.text._M_str;
              name_00._M_len = name.text._M_len;
              this_04 = (InterfacePortSymbol *)Scope::find(pSVar19,name_00);
              bVar8 = true;
              if (this_04 == (InterfacePortSymbol *)0x0) {
                pSVar20 = pSVar19->thisSym;
                if ((pSVar20->kind != Modport) ||
                   (name_01._M_str = name.text._M_str, name_01._M_len = name.text._M_len,
                   this_04 = (InterfacePortSymbol *)Scope::find(pSVar20->parentScope,name_01),
                   this_04 == (InterfacePortSymbol *)0x0)) {
                  if (pSVar19->deferredMemberIndex != Invalid) {
                    Scope::elaborate(pSVar19);
                  }
                  this_02 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            pSVar19->nameMap;
                  uVar17 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                           operator()(this_02,&name.text);
                  __s1 = name.text._M_str;
                  __n = name.text._M_len;
                  uVar23 = uVar17 >> ((byte)*this_02 & 0x3f);
                  lVar4 = *(long *)(this_02 + 0x10);
                  lVar24 = (uVar17 & 0xff) * 4;
                  cVar29 = (&UNK_0047c76c)[lVar24];
                  cVar30 = (&UNK_0047c76d)[lVar24];
                  cVar31 = (&UNK_0047c76e)[lVar24];
                  cVar32 = (&UNK_0047c76f)[lVar24];
                  SVar13._0_4_ = (uint)uVar17 & 7;
                  SVar13._4_4_ = 0;
                  uVar21 = 0;
                  cVar33 = cVar29;
                  cVar34 = cVar30;
                  cVar35 = cVar31;
                  cVar36 = cVar32;
                  cVar37 = cVar29;
                  cVar38 = cVar30;
                  cVar39 = cVar31;
                  cVar40 = cVar32;
                  cVar41 = cVar29;
                  cVar42 = cVar30;
                  cVar43 = cVar31;
                  cVar44 = cVar32;
                  do {
                    pcVar1 = (char *)(lVar4 + uVar23 * 0x10);
                    auVar28[0] = -(*pcVar1 == cVar29);
                    auVar28[1] = -(pcVar1[1] == cVar30);
                    auVar28[2] = -(pcVar1[2] == cVar31);
                    auVar28[3] = -(pcVar1[3] == cVar32);
                    auVar28[4] = -(pcVar1[4] == cVar33);
                    auVar28[5] = -(pcVar1[5] == cVar34);
                    auVar28[6] = -(pcVar1[6] == cVar35);
                    auVar28[7] = -(pcVar1[7] == cVar36);
                    auVar28[8] = -(pcVar1[8] == cVar37);
                    auVar28[9] = -(pcVar1[9] == cVar38);
                    auVar28[10] = -(pcVar1[10] == cVar39);
                    auVar28[0xb] = -(pcVar1[0xb] == cVar40);
                    auVar28[0xc] = -(pcVar1[0xc] == cVar41);
                    auVar28[0xd] = -(pcVar1[0xd] == cVar42);
                    auVar28[0xe] = -(pcVar1[0xe] == cVar43);
                    auVar28[0xf] = -(pcVar1[0xf] == cVar44);
                    uVar10 = (uint)(ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                                            (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                                            (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                                            (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                                            (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                                            (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                                            (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                                            (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                                            (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                                            (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                                            (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                                            (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                                            (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                                            (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                                           (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe);
                    if (uVar10 != 0) {
                      SVar18 = (SourceLocation)(*(long *)(this_02 + 0x18) + uVar23 * 0x168);
                      local_68 = cVar29;
                      cStack_67 = cVar30;
                      cStack_66 = cVar31;
                      cStack_65 = cVar32;
                      cStack_64 = cVar33;
                      cStack_63 = cVar34;
                      cStack_62 = cVar35;
                      cStack_61 = cVar36;
                      cStack_60 = cVar37;
                      cStack_5f = cVar38;
                      cStack_5e = cVar39;
                      cStack_5d = cVar40;
                      cStack_5c = cVar41;
                      cStack_5b = cVar42;
                      cStack_5a = cVar43;
                      cStack_59 = cVar44;
                      do {
                        uVar5 = 0;
                        if (uVar10 != 0) {
                          for (; (uVar10 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                          }
                        }
                        psVar26 = (size_t *)((long)SVar18 + (ulong)uVar5 * 0x18);
                        bVar8 = __n == *psVar26;
                        if (bVar8 && __n != 0) {
                          iVar12 = bcmp(__s1,(void *)psVar26[1],__n);
                          bVar8 = iVar12 == 0;
                          cVar29 = local_68;
                          cVar30 = cStack_67;
                          cVar31 = cStack_66;
                          cVar32 = cStack_65;
                          cVar33 = cStack_64;
                          cVar34 = cStack_63;
                          cVar35 = cStack_62;
                          cVar36 = cStack_61;
                          cVar37 = cStack_60;
                          cVar38 = cStack_5f;
                          cVar39 = cStack_5e;
                          cVar40 = cStack_5d;
                          cVar41 = cStack_5c;
                          cVar42 = cStack_5b;
                          cVar43 = cStack_5a;
                          cVar44 = cStack_59;
                        }
                        if (bVar8) goto LAB_002eefb5;
                        uVar10 = uVar10 - 1 & uVar10;
                      } while (uVar10 != 0);
                    }
                    SVar18 = SVar13;
                    if ((*(byte *)(uVar23 * 0x10 + lVar4 + 0xf) &
                        (&boost::unordered::detail::foa::
                          group15<boost::unordered::detail::foa::plain_integral>::
                          is_not_overflowed(unsigned_long)::shift)[(long)SVar13]) == 0) {
                      psVar26 = (size_t *)0x0;
                      goto LAB_002eefb5;
                    }
                    lVar24 = uVar23 + uVar21;
                    uVar21 = uVar21 + 1;
                    uVar23 = lVar24 + 1U & *(ulong *)(this_02 + 8);
                  } while (uVar21 <= *(ulong *)(this_02 + 8));
                  psVar26 = (size_t *)0x0;
LAB_002eefb5:
                  if ((psVar26 == (size_t *)0x0) || (*(int *)psVar26[2] != 0x44)) {
                    bVar8 = true;
                  }
                  else {
                    bVar8 = false;
                    unaff_R13B = 0;
                  }
                  if (!bVar8) goto LAB_002eede0;
                  if ((pSVar20->kind == GenerateBlockArray) || (pSVar20->kind == InstanceArray)) {
                    Diagnostics::add(this_00,((context->scope).ptr)->thisSym,(DiagCode)0x8000a,
                                     pNVar22[-1].dotLocation);
                  }
                  else {
                    pDVar14 = Diagnostics::add(this_00,((context->scope).ptr)->thisSym,
                                               (DiagCode)0x5000a,pNVar22[-1].dotLocation);
                    arg_01._M_str = name.text._M_str;
                    arg_01._M_len = name.text._M_len;
                    Diagnostic::operator<<(pDVar14,arg_01);
                    range_01.endLoc = name.range.endLoc;
                    range_01.startLoc = name.range.startLoc;
                    Diagnostic::operator<<(pDVar14,range_01);
                  }
                  goto LAB_002eec60;
                }
                bVar9 = SemanticFacts::isAllowedInModport((this_04->super_Symbol).kind);
                if ((bVar9) || ((this_04->super_Symbol).kind == Modport)) {
                  pDVar16 = Symbol::getDeclaringDefinition(pSVar20);
                  range_00.endLoc = name.range.endLoc;
                  range_00.startLoc = name.range.startLoc;
                  SVar18 = name.range.endLoc;
                  pDVar14 = Diagnostics::add(this_00,((context->scope).ptr)->thisSym,
                                             (DiagCode)0x14000a,range_00);
                  arg_00._M_str = name.text._M_str;
                  arg_00._M_len = name.text._M_len;
                  Diagnostic::operator<<(pDVar14,arg_00);
                  Diagnostic::operator<<(pDVar14,(pDVar16->super_Symbol).name);
                  Diagnostic::operator<<(pDVar14,pSVar20->name);
                  goto LAB_002eedda;
                }
              }
              iVar12 = 0;
              goto LAB_002eede5;
            }
          }
LAB_002eeab1:
          bVar8 = false;
          iVar12 = 1;
          unaff_R13B = 0;
        }
      }
LAB_002eede5:
      if (!bVar8) goto LAB_002ef061;
      pNVar22 = pNVar22 + -1;
    } while (pNVar22 != pNVar25);
    iVar12 = 4;
LAB_002ef061:
    bVar27 = iVar12 == 4;
  }
LAB_002ef0f5:
  if (!bVar27) goto LAB_002ef294;
  if (((this_04 == (InterfacePortSymbol *)0x0) || ((this_04->super_Symbol).kind == GenericClassDef))
     || (name.paramAssignments == (ParameterValueAssignmentSyntax *)0x0)) {
    bVar7 = (result->flags).m_bits;
    if (((bVar7 & 0x22) != 0) && (this_04 != (InterfacePortSymbol *)0x0)) {
      if ((bVar7 & 2) != 0) {
        uVar10 = (this_04->super_Symbol).kind - Variable;
        if (((uVar10 < 0x19) && ((0x1800c0fU >> (uVar10 & 0x1f) & 1) != 0)) &&
           (*(int *)&this_04[2].range.
                     super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
                     ._M_payload == 0)) {
          pSVar20 = ((context->scope).ptr)->thisSym;
          code_00.subsystem = Lookup;
          code_00.code = 1;
        }
        else {
          bVar27 = Symbol::isType(&this_04->super_Symbol);
          if (!bVar27) goto LAB_002ef1fa;
          pSVar20 = ((context->scope).ptr)->thisSym;
          code_00.subsystem = Lookup;
          code_00.code = 0x31;
        }
        range_07.endLoc = name.range.endLoc;
        range_07.startLoc = name.range.startLoc;
        Diagnostics::add(&result->diagnostics,pSVar20,code_00,range_07);
        goto LAB_002ef291;
      }
LAB_002ef1fa:
      SmallVectorBase<slang::ast::HierarchicalReference::Element>::
      emplace_back<slang::ast::Symbol_const&>
                (&(result->path).super_SmallVectorBase<slang::ast::HierarchicalReference::Element>,
                 &this_04->super_Symbol);
    }
    result->found = &this_04->super_Symbol;
    unaff_R13B = 1;
    if (name.selectors._M_extent._M_extent_value != 0) {
      if (((this_04 == (InterfacePortSymbol *)0x0) ||
          (pSVar19 = Symbol::scopeOrNull(&this_04->super_Symbol), pSVar19 == (Scope *)0x0)) ||
         (bVar27 = Symbol::isType(result->found), bVar27)) {
        SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
        ::
        append<__gnu_cxx::__normal_iterator<const_slang::syntax::ElementSelectSyntax_*const_*,_std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>_>_>
                  (&(result->selectors).
                    super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                   ,(__normal_iterator<const_slang::syntax::ElementSelectSyntax_*const_*,_std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>_>
                     )name.selectors._M_ptr,
                   (__normal_iterator<const_slang::syntax::ElementSelectSyntax_*const_*,_std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>_>
                    )(name.selectors._M_ptr + name.selectors._M_extent._M_extent_value));
      }
      else {
        selectors_00._M_extent._M_extent_value = (size_t)context;
        selectors_00._M_ptr = (pointer)name.selectors._M_extent._M_extent_value;
        pSVar20 = Lookup::selectChild((Lookup *)result->found,(Symbol *)name.selectors._M_ptr,
                                      selectors_00,(ASTContext *)result,in_R9);
        result->found = pSVar20;
      }
    }
  }
  else {
    pSVar19 = (context->scope).ptr;
    local_98._0_16_ =
         (undefined1  [16])
         slang::syntax::SyntaxNode::getFirstToken(&(name.paramAssignments)->super_SyntaxNode);
    SVar18 = parsing::Token::location((Token *)&local_98._M_first);
    pDVar14 = Diagnostics::add(&result->diagnostics,pSVar19->thisSym,(DiagCode)0x1f000a,SVar18);
    range_03.endLoc = name.range.endLoc;
    range_03.startLoc = name.range.startLoc;
    Diagnostic::operator<<(pDVar14,range_03);
    Diagnostic::operator<<(pDVar14,(this_04->super_Symbol).name);
    Diagnostic::addNote(pDVar14,(DiagCode)0x50001,(this_04->super_Symbol).location);
LAB_002ef291:
    unaff_R13B = 0;
  }
LAB_002ef294:
  return (bool)(unaff_R13B & 1);
}

Assistant:

bool lookupDownward(std::span<const NamePlusLoc> nameParts, NameComponents name,
                    const ASTContext& context, bitmask<LookupFlags> flags, LookupResult& result) {
    const Symbol* symbol = std::exchange(result.found, nullptr);
    SLANG_ASSERT(symbol);

    // Helper function to check whether class parameter assignments have been
    // incorrectly supplied for a non-class symbol.
    auto checkClassParams = [&](const NameComponents& nc) {
        if (symbol && symbol->kind != SymbolKind::GenericClassDef && nc.paramAssignments) {
            auto& diag = result.addDiag(*context.scope, diag::NotAGenericClass,
                                        nc.paramAssignments->getFirstToken().location());
            diag << nc.range;
            diag << symbol->name;
            diag.addNote(diag::NoteDeclarationHere, symbol->location);
            return false;
        }
        return true;
    };

    // Loop through each dotted name component and try to find it in the preceeding scope.
    bool isVirtualIface = false;
    for (auto it = nameParts.rbegin(); it != nameParts.rend(); it++) {
        if (!checkClassParams(name))
            return false;

        auto isValueLike = [&](const Symbol*& symbol) {
            switch (symbol->kind) {
                case SymbolKind::ConstraintBlock:
                case SymbolKind::Coverpoint:
                case SymbolKind::CoverCross:
                case SymbolKind::Sequence:
                case SymbolKind::Property:
                case SymbolKind::LetDecl:
                case SymbolKind::AssertionPort:
                    return true;
                default: {
                    if (!symbol->isValue())
                        return false;

                    // If this is a virtual interface value we should unwrap to
                    // the target interface and continue the hierarchical lookup.
                    auto& type = symbol->as<ValueSymbol>().getType();
                    if (type.isVirtualInterface()) {
                        isVirtualIface = true;
                        context.getCompilation().noteReference(*symbol);
                        symbol = getVirtualInterfaceTarget(type, context, name.range);
                        return false;
                    }

                    return true;
                }
            }
        };

        // If we found a value, the remaining dots are member access expressions.
        if (isValueLike(symbol)) {
            result.selectors.append_range(name.selectors);

            for (; it != nameParts.rend(); it++) {
                auto& memberName = it->name;
                result.selectors.push_back(LookupResult::MemberSelector{
                    memberName.text, it->dotLocation, memberName.range});

                result.selectors.append_range(memberName.selectors);

                if (!checkClassParams(memberName))
                    return false;
            }

            // Break out to return the symbol.
            name.selectors = {};
            break;
        }

        // This is a hierarchical lookup if we previously decided it was hierarchical, or:
        // - This is not a clocking block access
        // - This is not a virtual interface access (or descended from one)
        // - This is not a direct interface port, package, or $unit reference
        const bool isCBOrVirtualIface = symbol->kind == SymbolKind::ClockingBlock || isVirtualIface;
        if (it == nameParts.rbegin()) {
            if (symbol->kind == SymbolKind::InterfacePort) {
                result.flags |= LookupResultFlags::IfacePort;
                result.path.emplace_back(*symbol);
            }
            else if (symbol->kind != SymbolKind::Package &&
                     symbol->kind != SymbolKind::CompilationUnit && !isCBOrVirtualIface) {
                result.flags |= LookupResultFlags::IsHierarchical;
                result.path.emplace_back(*symbol);
            }
        }
        else if (flags.has(LookupFlags::IfacePortConn) &&
                 (symbol->kind == SymbolKind::GenerateBlock ||
                  symbol->kind == SymbolKind::GenerateBlockArray ||
                  symbol->kind == SymbolKind::InstanceArray)) {
            SourceRange errorRange{name.range.start(), (nameParts.rend() - 1)->name.range.end()};
            result.addDiag(*context.scope, diag::InvalidHierarchicalIfacePortConn, errorRange);
            return false;
        }
        else if (!isCBOrVirtualIface) {
            result.flags |= LookupResultFlags::IsHierarchical;
            result.path.emplace_back(*symbol);
        }

        const ModportSymbol* modport = nullptr;
        if (symbol->kind == SymbolKind::InterfacePort) {
            auto& ifacePort = symbol->as<InterfacePortSymbol>();
            std::tie(symbol, modport) = ifacePort.getConnection();
            if (!symbol)
                return false;
        }

        if ((!symbol->isScope() && symbol->kind != SymbolKind::Instance) || symbol->isType() ||
            symbol->kind == SymbolKind::Checker) {
            // If we found an uninstantiated def, exit silently. An appropriate error was
            // already issued, so no need to pile on.
            if (symbol->kind == SymbolKind::UninstantiatedDef)
                return false;

            symbol = unwrapTypeParam(*context.scope, symbol);
            if (!symbol)
                return false;

            bool isType;
            if (symbol->isType()) {
                isType = true;
                if (symbol->as<Type>().isError())
                    return false;
            }
            else {
                isType = symbol->kind == SymbolKind::GenericClassDef;
            }

            DiagCode code;
            if (isType) {
                code = diag::DotOnType;
            }
            else if (symbol->kind == SymbolKind::Checker ||
                     symbol->kind == SymbolKind::CheckerInstance) {
                code = diag::CheckerHierarchical;
            }
            else {
                code = diag::NotAHierarchicalScope;
            }

            auto& diag = result.addDiag(*context.scope, code, it->dotLocation);
            diag << name.range;
            diag << it->name.range;

            if (!isType)
                diag << name.text;

            diag.addNote(diag::NoteDeclarationHere, symbol->location);
            return true;
        }

        if (!name.selectors.empty()) {
            symbol = Lookup::selectChild(*symbol, name.selectors, context, result);
            if (!symbol)
                return false;
        }

        if (symbol->kind == SymbolKind::Instance) {
            auto& body = symbol->as<InstanceSymbol>().body;
            symbol = &body;

            // If we had a modport restriction on an interface port lookup
            // we should switch to doing the next lookup in that modport's scope.
            // We need to re-lookup the modport symbol because the one we have
            // is just representative; the real one depends on the result of the
            // selectChild call we made above in the case of an interface array.
            if (modport) {
                symbol = body.find(modport->name);
                SLANG_ASSERT(symbol);
            }

            // If we're descending into a program instance, verify that
            // the original scope for the lookup is also within a program.
            if (body.getDefinition().definitionKind == DefinitionKind::Program &&
                !isInProgram(context.scope->asSymbol())) {
                SourceRange errorRange{name.range.start(),
                                       (nameParts.rend() - 1)->name.range.end()};
                result.addDiag(*context.scope, diag::IllegalReferenceToProgramItem, errorRange);
            }
        }
        else if (symbol->kind == SymbolKind::GenerateBlock &&
                 symbol->as<GenerateBlockSymbol>().isUninstantiated) {
            // Don't allow lookups into uninstantiated generate blocks, but do return
            // true so that the lookup can continue elsewhere.
            return true;
        }

        name = it->name;
        if (name.text.empty())
            return false;

        auto& scope = symbol->as<Scope>();
        symbol = scope.find(name.text);
        if (!symbol) {
            // If we did the lookup in a modport, check to see if the symbol actually
            // exists in the parent interface.
            auto& prevSym = scope.asSymbol();
            if (prevSym.kind != SymbolKind::Modport ||
                (symbol = prevSym.getParentScope()->find(name.text)) == nullptr) {

                // Check if we actually had a method prototype found here but it failed
                // to resolve due to some other error, in which case we should keep quiet.
                auto& nameMap = scope.getNameMap();
                if (auto scopeIt = nameMap.find(name.text);
                    scopeIt != nameMap.end() &&
                    scopeIt->second->kind == SymbolKind::MethodPrototype) {
                    return false;
                }

                // Which error we report depends on whether this is an array
                // (in which case the user needs to use an index expression instead
                // of dot access) or just some other symbol that is missing the
                // requested member.
                if (prevSym.kind == SymbolKind::GenerateBlockArray ||
                    prevSym.kind == SymbolKind::InstanceArray) {
                    result.addDiag(*context.scope, diag::DotIntoInstArray, it->dotLocation);
                }
                else {
                    auto& diag = result.addDiag(*context.scope,
                                                diag::CouldNotResolveHierarchicalPath,
                                                it->dotLocation);
                    diag << name.text;
                    diag << name.range;
                }
                return true;
            }

            // Variables, nets, subroutines can only be accessed via the modport.
            // Other symbols aren't permitted in a modport, so they are allowed
            // to be accessed through it as if we had accessed the interface
            // instance itself.
            if (SemanticFacts::isAllowedInModport(symbol->kind) ||
                symbol->kind == SymbolKind::Modport) {
                // This is an error, the modport disallows access.
                auto def = prevSym.getDeclaringDefinition();
                SLANG_ASSERT(def);

                auto& diag = result.addDiag(*context.scope, diag::InvalidModportAccess, name.range);
                diag << name.text;
                diag << def->name;
                diag << prevSym.name;
                return false;
            }
        }
    }

    if (!checkClassParams(name))
        return false;

    if (result.flags.has(LookupResultFlags::IsHierarchical | LookupResultFlags::IfacePort) &&
        symbol) {
        if (result.flags.has(LookupResultFlags::IsHierarchical)) {
            if (VariableSymbol::isKind(symbol->kind) &&
                symbol->as<VariableSymbol>().lifetime == VariableLifetime::Automatic) {
                // If we found an automatic variable check that we didn't try to reference it
                // hierarchically.
                result.addDiag(*context.scope, diag::AutoVariableHierarchical, name.range);
                return false;
            }
            else if (symbol->isType()) {
                // Types cannot be referenced hierarchically.
                result.addDiag(*context.scope, diag::TypeHierarchical, name.range);
                return false;
            }
        }
        result.path.emplace_back(*symbol);
    }

    result.found = symbol;

    if (!name.selectors.empty()) {
        // If this is a scope, the selectors should be an index into it.
        if (result.found && result.found->isScope() && !result.found->isType())
            result.found = Lookup::selectChild(*result.found, name.selectors, context, result);
        else
            result.selectors.append_range(name.selectors);
    }

    return true;
}